

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  void *pvVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 cord;
  string *s;
  ulong uVar9;
  code *ctx_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  ParseContext *extraout_RDX;
  ParseContext *ctx_01;
  ParseContext *entry;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ushort uVar10;
  Arena *pAVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar12;
  ParseContext *wire_bytes;
  uint16_t xform_val;
  uint64_t uVar13;
  size_t size;
  uint *puVar14;
  pair<const_char_*,_int> pVar15;
  string_view sVar16;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  ushort local_44;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_01;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_00f83b93;
  }
  uVar2 = *(ushort *)(table_00.data + 10);
  uVar10 = uVar2 & 0x30;
  if (uVar10 == 0x20) {
    pcVar7 = MpRepeatedString<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar13 = hasbits;
  if (uVar10 == 0x10) {
    uVar6 = *(uint *)(table_00.data + 4);
    ctx_00._4_4_ = 0;
    ctx_00._0_4_ = uVar6;
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar6 >> 5) * 4);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail();
    }
    *puVar14 = *puVar14 | 1 << ((byte)uVar6 & 0x1f);
LAB_00f83bf8:
    bVar4 = false;
  }
  else {
    ctx_00 = (code *)data.field_0;
    if (uVar10 != 0x30) goto LAB_00f83bf8;
    ctx_00._0_4_ = data.field_0._0_4_ >> 3;
    ctx_00._4_4_ = 0;
    bVar4 = ChangeOneof(table,(FieldEntry *)table_00,ctx_00._0_4_,(ParseContext *)ctx_00,msg);
  }
  xform_val = (uint16_t)uVar13;
  local_44 = uVar2 & 0x600;
  pvVar8 = MaybeGetSplitBase(msg,true,table);
  if ((uVar2 & 0x1c0) == 0x140) {
    cord.data = (long)pvVar8 + (ulong)*(uint *)table_00;
    if ((cord.data & 7) != 0) {
LAB_00f83f4d:
      AlignFail(cord.data);
    }
    if (bVar4 != false) {
      *(void **)cord = (void *)0x0;
    }
    pAVar11 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    uVar6 = (uint)(byte)*ptr;
    if (*ptr < '\0') {
      pVar15 = ReadSizeFallback(ptr,uVar6);
      pcVar7 = pVar15.first;
      if (pcVar7 != (char *)0x0) {
        uVar6 = pVar15.second;
        goto LAB_00f83d84;
      }
      ptr = (char *)0x0;
    }
    else {
      pcVar7 = ptr + 1;
LAB_00f83d84:
      iVar5 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar7);
      if (iVar5 < (int)uVar6) {
        ptr = EpsCopyInputStream::ReadMicroStringFallback
                        (&ctx->super_EpsCopyInputStream,pcVar7,uVar6,(MicroString *)cord,pAVar11);
      }
      else {
        sVar16._M_str = pcVar7;
        sVar16._M_len = (long)(int)uVar6;
        MicroString::SetImpl((MicroString *)cord,sVar16,pAVar11,7);
        ptr = pcVar7 + (int)uVar6;
      }
    }
    sVar16 = MicroString::Get((MicroString *)cord);
    table_01.data = (uint64_t)sVar16._M_str;
    wire_bytes_01._M_str = (char *)table;
    wire_bytes_01._M_len = table_01.data;
    bVar4 = MpVerifyUtf8((TcParser *)sVar16._M_len,wire_bytes_01,(TcParseTableBase *)table_00,
                         (FieldEntry *)(ulong)local_44,xform_val);
    ctx_01 = extraout_RDX_01;
  }
  else if ((uVar2 & 0x1c0) == 0x80) {
    if (uVar10 == 0x30) {
      if (bVar4 == false) {
        paVar12 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
        if (((ulong)paVar12 & 7) != 0) goto LAB_00f83fa6;
        cord = *paVar12;
      }
      else {
        pAVar11 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        if (pAVar11 == (Arena *)0x0) {
          cord = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          ctx_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          cord = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 Arena::AllocateAlignedWithCleanup
                           (pAVar11,0x10,8,cleanup::arena_destruct_object<absl::lts_20250127::Cord>)
          ;
        }
        *(undefined8 *)cord = 0;
        *(undefined8 *)(cord.data + 8) = 0;
        paVar12 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
        if (((ulong)paVar12 & 7) != 0) {
LAB_00f83fa6:
          AlignFail();
        }
        paVar12->data = (uint64_t)cord;
      }
    }
    else {
      ctx_00._4_4_ = 0;
      ctx_00._0_4_ = *(uint *)table_00;
      cord.data = (long)pvVar8 + (long)ctx_00;
      if ((cord.data & 7) != 0) goto LAB_00f83f4d;
    }
    bVar1 = *ptr;
    if ((char)bVar1 < '\0') {
      table_01.data._4_4_ = 0;
      table_01.data._0_4_ = CONCAT31(0,bVar1);
      pVar15 = ReadSizeFallback(ptr,CONCAT31(0,bVar1));
      auVar3 = pVar15._0_12_;
      ctx_01 = pVar15._8_8_;
      if (pVar15.first == (char *)0x0) goto LAB_00f83f82;
    }
    else {
      auVar3[8] = bVar1;
      auVar3._0_8_ = ptr + 1;
      auVar3._9_3_ = 0;
    }
    table_01.data = auVar3._0_8_;
    wire_bytes = ctx;
    ptr = EpsCopyInputStream::ReadCord
                    (&ctx->super_EpsCopyInputStream,(char *)table_01,auVar3._8_4_,(Cord *)cord);
    ctx_00 = (code *)cord;
    ctx_01 = entry;
    if ((ushort *)ptr == (ushort *)0x0) goto LAB_00f83f82;
    table_00.data._2_6_ = 0;
    table_00.data._0_2_ = local_44;
    MpVerifyUtf8((Cord *)wire_bytes,(TcParseTableBase *)table_01,(FieldEntry *)entry,local_44);
    bVar4 = true;
    ctx_01 = extraout_RDX_00;
  }
  else {
    if ((uVar2 & 0x1c0) != 0) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    cord.data = (long)pvVar8 + (ulong)*(uint *)table_00;
    if ((cord.data & 7) != 0) goto LAB_00f83f4d;
    if (bVar4 != false) {
      *(undefined8 **)cord = &fixed_address_empty_string;
    }
    ctx_00 = (code *)(msg->_internal_metadata_).ptr_;
    if (((ulong)ctx_00 & 1) != 0) {
      ctx_00 = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                       ((ulong)ctx_00 & 0xfffffffffffffffe))->data;
    }
    if (ctx_00 == (code *)0x0) {
      s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)cord,(Arena *)0x0);
      ptr = InlineGreedyStringParser(s,ptr,ctx);
    }
    else {
      ptr = EpsCopyInputStream::ReadArenaString
                      (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)cord,(Arena *)ctx_00);
    }
    if ((ushort *)ptr == (ushort *)0x0) {
      anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)cord);
      ctx_01 = extraout_RDX_02;
      table_01 = cord;
      goto LAB_00f83f82;
    }
    table_01 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
               ((ulong)*(void **)cord & 0xfffffffffffffffc))->data;
    wire_bytes_00._M_str = (char *)table;
    wire_bytes_00._M_len = table_01.data;
    bVar4 = MpVerifyUtf8((TcParser *)
                         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                         ((ulong)*(void **)cord & 0xfffffffffffffffc))[1],wire_bytes_00,
                         (TcParseTableBase *)table_00,(FieldEntry *)(ulong)local_44,xform_val);
    ctx_01 = extraout_RDX;
  }
  ctx_00 = (code *)table_00;
  if ((bVar4 != false) && ((ushort *)ptr != (ushort *)0x0)) {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail(puVar14);
        }
        *puVar14 = *puVar14 | (uint)hasbits;
      }
      return (char *)(ushort *)ptr;
    }
    uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar6 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar9 = (ulong)(uVar6 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
LAB_00f83b93:
    pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
LAB_00f83f82:
  pcVar7 = Error(msg,(char *)table_01,ctx_01,(TcFieldData)ctx_00,table,hasbits);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
        EnsureArenaStringIsNotDefault(msg, &field);
        break;
      }
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }

    case field_layout::kRepMString: {
      auto& field = RefAt<MicroString>(base, entry.offset);
      if (need_init) field.InitDefault();
      ptr = ctx->ReadMicroString(ptr, field, msg->GetArena());
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}